

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O1

ZeroCopyOutputStream * __thiscall
google::protobuf::compiler::GeneratorResponseContext::Open
          (GeneratorResponseContext *this,string *filename)

{
  void *pvVar1;
  StringOutputStream *this_00;
  string *target;
  Arena *pAVar2;
  
  pvVar1 = internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(this->response_->field_0)._impl_.file_.super_RepeatedPtrFieldBase,
                      Arena::
                      DefaultConstruct<google::protobuf::compiler::CodeGeneratorResponse_File>);
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>((ArenaStringPtr *)((long)pvVar1 + 0x18),filename,pAVar2);
  this_00 = (StringOutputStream *)operator_new(0x10);
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 4;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  target = internal::ArenaStringPtr::Mutable_abi_cxx11_
                     ((ArenaStringPtr *)((long)pvVar1 + 0x28),pAVar2);
  io::StringOutputStream::StringOutputStream(this_00,target);
  return &this_00->super_ZeroCopyOutputStream;
}

Assistant:

io::ZeroCopyOutputStream* Open(const std::string& filename) override {
    CodeGeneratorResponse::File* file = response_->add_file();
    file->set_name(filename);
    return new io::StringOutputStream(file->mutable_content());
  }